

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O0

void string_conversion_test(void)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  ulong uVar4;
  void *pvVar5;
  element_type *__s1;
  pointer __s1_00;
  undefined1 trim_trailing_zeroes;
  int length;
  undefined8 in_RCX;
  int in_R8D;
  undefined1 local_3b0 [8];
  string small_negative;
  string small_positive;
  string int_min_minus_1_str;
  string int_max_plus_1_str;
  longlong int_min_minus_1;
  longlong int_max_plus_1;
  string int_min_str;
  string int_max_str;
  unique_ptr<char[],_std::default_delete<char[]>_> tmp3;
  shared_ptr<char> tmp2;
  char *tmp;
  undefined1 local_2b8 [8];
  string embedded_null;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_28;
  
  set_locale();
  QUtil::int_to_string_abi_cxx11_(&local_28,(QUtil *)0x3ebb,0,(int)in_RCX);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_28);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  QUtil::int_to_string_abi_cxx11_(&local_58,(QUtil *)0x3ebb,7,(int)in_RCX);
  poVar2 = std::operator<<(poVar2,(string *)&local_58);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  QUtil::int_to_string_abi_cxx11_(&local_78,(QUtil *)0x3ebb,0xfffffff9,(int)in_RCX);
  trim_trailing_zeroes = (undefined1)in_RCX;
  poVar2 = std::operator<<(poVar2,(string *)&local_78);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  QUtil::double_to_string_abi_cxx11_(&local_98,(QUtil *)0x0,3.14159,0,(bool)trim_trailing_zeroes);
  poVar2 = std::operator<<(poVar2,(string *)&local_98);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  QUtil::double_to_string_abi_cxx11_(&local_b8,(QUtil *)0x3,3.14159,1,(bool)trim_trailing_zeroes);
  poVar2 = std::operator<<(poVar2,(string *)&local_b8);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  QUtil::double_to_string_abi_cxx11_
            (&local_d8,(QUtil *)0xfffffc00,1000.123,0,(bool)trim_trailing_zeroes);
  poVar2 = std::operator<<(poVar2,(string *)&local_d8);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  QUtil::double_to_string_abi_cxx11_(&local_f8,(QUtil *)0x5,0.1234,0,(bool)trim_trailing_zeroes);
  poVar2 = std::operator<<(poVar2,(string *)&local_f8);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  QUtil::double_to_string_abi_cxx11_(&local_118,(QUtil *)0x5,0.0001234,1,(bool)trim_trailing_zeroes)
  ;
  poVar2 = std::operator<<(poVar2,(string *)&local_118);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  QUtil::double_to_string_abi_cxx11_(&local_138,(QUtil *)0x5,0.123456,1,(bool)trim_trailing_zeroes);
  poVar2 = std::operator<<(poVar2,(string *)&local_138);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  QUtil::double_to_string_abi_cxx11_
            (&local_158,(QUtil *)0x5,0.000123456,1,(bool)trim_trailing_zeroes);
  poVar2 = std::operator<<(poVar2,(string *)&local_158);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  QUtil::double_to_string_abi_cxx11_(&local_178,(QUtil *)0x5,1.0102,1,(bool)trim_trailing_zeroes);
  poVar2 = std::operator<<(poVar2,(string *)&local_178);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  QUtil::double_to_string_abi_cxx11_(&local_198,(QUtil *)0x5,1.0,1,(bool)trim_trailing_zeroes);
  poVar2 = std::operator<<(poVar2,(string *)&local_198);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  QUtil::double_to_string_abi_cxx11_(&local_1b8,(QUtil *)0x5,1.0,1,(bool)trim_trailing_zeroes);
  poVar2 = std::operator<<(poVar2,(string *)&local_1b8);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  QUtil::double_to_string_abi_cxx11_(&local_1d8,(QUtil *)0x5,1.0,0,(bool)trim_trailing_zeroes);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  QUtil::double_to_string_abi_cxx11_(&local_1f8,(QUtil *)0x2,10.0,0,(bool)trim_trailing_zeroes);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f8);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  QUtil::double_to_string_abi_cxx11_(&local_218,(QUtil *)0x2,10.0,1,(bool)trim_trailing_zeroes);
  poVar2 = std::operator<<(poVar2,(string *)&local_218);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  QUtil::int_to_string_base_abi_cxx11_(&local_238,(QUtil *)0x3ebb,10,0,in_R8D);
  poVar2 = std::operator<<(poVar2,(string *)&local_238);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  QUtil::int_to_string_base_abi_cxx11_(&local_258,(QUtil *)0x3ebb,8,0,in_R8D);
  poVar2 = std::operator<<(poVar2,(string *)&local_258);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  QUtil::int_to_string_base_abi_cxx11_(&local_278,(QUtil *)0x3ebb,0x10,0,in_R8D);
  poVar2 = std::operator<<(poVar2,(string *)&local_278);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  length = 0;
  QUtil::int_to_string_base_abi_cxx11_
            ((string *)((long)&embedded_null.field_2 + 8),(QUtil *)0x12a075f70,10,0,in_R8D);
  poVar2 = std::operator<<(poVar2,(string *)(embedded_null.field_2._M_local_buf + 8));
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)(embedded_null.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2b8,"one",(allocator<char> *)((long)&tmp + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&tmp + 7));
  std::__cxx11::string::operator+=((string *)local_2b8,'\0');
  std::__cxx11::string::operator+=((string *)local_2b8,"two");
  pcVar3 = (char *)std::__cxx11::string::c_str();
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  uVar4 = std::__cxx11::string::length();
  pvVar5 = (void *)std::ostream::operator<<(&std::cout,uVar4);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  pcVar3 = QUtil::copy_string((string *)local_2b8);
  pvVar5 = (void *)std::__cxx11::string::c_str();
  iVar1 = memcmp(pcVar3,pvVar5,7);
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"compare okay");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"compare failed");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  if (pcVar3 != (char *)0x0) {
    operator_delete__(pcVar3);
  }
  QUtil::make_shared_cstr((QUtil *)&tmp3,(string *)local_2b8);
  __s1 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)&tmp3);
  pvVar5 = (void *)std::__cxx11::string::c_str();
  iVar1 = memcmp(__s1,pvVar5,7);
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"compare okay");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"compare failed");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  QUtil::make_unique_cstr((QUtil *)(int_max_str.field_2._M_local_buf + 8),(string *)local_2b8);
  __s1_00 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                      ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                       ((long)&int_max_str.field_2 + 8));
  pvVar5 = (void *)std::__cxx11::string::c_str();
  iVar1 = memcmp(__s1_00,pvVar5,7);
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"compare okay");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"compare failed");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  QUtil::int_to_string_abi_cxx11_
            ((string *)((long)&int_min_str.field_2 + 8),(QUtil *)0x7fffffff,0,length);
  QUtil::int_to_string_abi_cxx11_((string *)&int_max_plus_1,(QUtil *)0xffffffff80000000,0,length);
  QUtil::int_to_string_abi_cxx11_
            ((string *)((long)&int_min_minus_1_str.field_2 + 8),(QUtil *)0x80000000,0,length);
  QUtil::int_to_string_abi_cxx11_
            ((string *)((long)&small_positive.field_2 + 8),(QUtil *)0xffffffff7fffffff,0,length);
  QUtil::uint_to_string_abi_cxx11_
            ((string *)((long)&small_negative.field_2 + 8),(QUtil *)0x3ebb,0,length);
  QUtil::int_to_string_abi_cxx11_((string *)local_3b0,(QUtil *)0xffffffffffffc145,0,length);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  test_to_int(pcVar3,-0x80000000,false);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  test_to_int(pcVar3,0x7fffffff,false);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  test_to_int(pcVar3,0,true);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  test_to_int(pcVar3,0,true);
  test_to_int("9999999999999999999999999",0,true);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  test_to_ll(pcVar3,0x80000000,false);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  test_to_ll(pcVar3,-0x80000001,false);
  test_to_ll("99999999999999999999999999999999999999999999999999",0,true);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  test_to_uint(pcVar3,0x3ebb,false);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  test_to_uint(pcVar3,0,true);
  test_to_uint("9999999999",0,true);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  test_to_ull(pcVar3,0x3ebb,false);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  test_to_ull(pcVar3,0,true);
  std::__cxx11::string::~string((string *)local_3b0);
  std::__cxx11::string::~string((string *)(small_negative.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(small_positive.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(int_min_minus_1_str.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&int_max_plus_1);
  std::__cxx11::string::~string((string *)(int_min_str.field_2._M_local_buf + 8));
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)((long)&int_max_str.field_2 + 8));
  std::shared_ptr<char>::~shared_ptr((shared_ptr<char> *)&tmp3);
  std::__cxx11::string::~string((string *)local_2b8);
  return;
}

Assistant:

void
string_conversion_test()
{
    // Make sure the code produces consistent results even if we load
    // a non-C locale.
    set_locale();
    std::cout << QUtil::int_to_string(16059) << std::endl
              << QUtil::int_to_string(16059, 7) << std::endl
              << QUtil::int_to_string(16059, -7) << std::endl
              << QUtil::double_to_string(3.14159, 0, false) << std::endl
              << QUtil::double_to_string(3.14159, 3) << std::endl
              << QUtil::double_to_string(1000.123, -1024, false) << std::endl
              << QUtil::double_to_string(.1234, 5, false) << std::endl
              << QUtil::double_to_string(.0001234, 5) << std::endl
              << QUtil::double_to_string(.123456, 5) << std::endl
              << QUtil::double_to_string(.000123456, 5) << std::endl
              << QUtil::double_to_string(1.01020, 5, true) << std::endl
              << QUtil::double_to_string(1.00000, 5, true) << std::endl
              << QUtil::double_to_string(1, 5, true) << std::endl
              << QUtil::double_to_string(1, 5, false) << std::endl
              << QUtil::double_to_string(10, 2, false) << std::endl
              << QUtil::double_to_string(10, 2, true) << std::endl
              << QUtil::int_to_string_base(16059, 10) << std::endl
              << QUtil::int_to_string_base(16059, 8) << std::endl
              << QUtil::int_to_string_base(16059, 16) << std::endl
              << QUtil::int_to_string_base(5000093552LL, 10) << std::endl;

    std::string embedded_null = "one";
    embedded_null += '\0';
    embedded_null += "two";
    std::cout << embedded_null.c_str() << std::endl;
    std::cout << embedded_null.length() << std::endl;
    char* tmp = QUtil::copy_string(embedded_null);
    if (memcmp(tmp, embedded_null.c_str(), 7) == 0) {
        std::cout << "compare okay" << std::endl;
    } else {
        std::cout << "compare failed" << std::endl;
    }
    delete[] tmp;
    // Also test with make_shared_cstr and make_unique_cstr
    auto tmp2 = QUtil::make_shared_cstr(embedded_null);
    if (memcmp(tmp2.get(), embedded_null.c_str(), 7) == 0) {
        std::cout << "compare okay" << std::endl;
    } else {
        std::cout << "compare failed" << std::endl;
    }
    auto tmp3 = QUtil::make_unique_cstr(embedded_null);
    if (memcmp(tmp3.get(), embedded_null.c_str(), 7) == 0) {
        std::cout << "compare okay" << std::endl;
    } else {
        std::cout << "compare failed" << std::endl;
    }

    std::string int_max_str = QUtil::int_to_string(INT_MAX);
    std::string int_min_str = QUtil::int_to_string(INT_MIN);
    long long int_max_plus_1 = static_cast<long long>(INT_MAX) + 1;
    long long int_min_minus_1 = static_cast<long long>(INT_MIN) - 1;
    std::string int_max_plus_1_str = QUtil::int_to_string(int_max_plus_1);
    std::string int_min_minus_1_str = QUtil::int_to_string(int_min_minus_1);
    std::string small_positive = QUtil::uint_to_string(16059U);
    std::string small_negative = QUtil::int_to_string(-16059);
    test_to_int(int_min_str.c_str(), INT_MIN, false);
    test_to_int(int_max_str.c_str(), INT_MAX, false);
    test_to_int(int_max_plus_1_str.c_str(), 0, true);
    test_to_int(int_min_minus_1_str.c_str(), 0, true);
    test_to_int("9999999999999999999999999", 0, true);
    test_to_ll(int_max_plus_1_str.c_str(), int_max_plus_1, false);
    test_to_ll(int_min_minus_1_str.c_str(), int_min_minus_1, false);
    test_to_ll("99999999999999999999999999999999999999999999999999", 0, true);
    test_to_uint(small_positive.c_str(), 16059U, false);
    test_to_uint(small_negative.c_str(), 0, true);
    test_to_uint("9999999999", 0, true);
    test_to_ull(small_positive.c_str(), 16059U, false);
    test_to_ull(small_negative.c_str(), 0, true);
}